

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

NestedCompositeComponents * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateScalarInterfaceVarsForArray
          (NestedCompositeComponents *__return_storage_ptr__,
          InterfaceVariableScalarReplacement *this,Instruction *interface_var_type,
          StorageClass storage_class,uint32_t extra_array_length)

{
  Op OVar1;
  IRContext *this_00;
  DefUseManager *def_use_mgr_00;
  Instruction *interface_var_type_00;
  undefined1 local_68 [8];
  NestedCompositeComponents scalar_vars_for_element;
  Instruction *elem_type;
  uint32_t array_length;
  DefUseManager *def_use_mgr;
  uint32_t extra_array_length_local;
  StorageClass storage_class_local;
  Instruction *interface_var_type_local;
  InterfaceVariableScalarReplacement *this_local;
  NestedCompositeComponents *scalar_vars;
  
  OVar1 = opt::Instruction::opcode(interface_var_type);
  if (OVar1 != OpTypeArray) {
    __assert_fail("interface_var_type->opcode() == spv::Op::OpTypeArray",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                  ,0x322,
                  "InterfaceVariableScalarReplacement::NestedCompositeComponents spvtools::opt::InterfaceVariableScalarReplacement::CreateScalarInterfaceVarsForArray(Instruction *, spv::StorageClass, uint32_t)"
                 );
  }
  this_00 = Pass::context(&this->super_Pass);
  def_use_mgr_00 = IRContext::get_def_use_mgr(this_00);
  elem_type._4_4_ = anon_unknown_0::GetArrayLength(def_use_mgr_00,interface_var_type);
  interface_var_type_00 = anon_unknown_0::GetArrayElementType(def_use_mgr_00,interface_var_type);
  scalar_vars_for_element.component_variable._7_1_ = 0;
  NestedCompositeComponents::NestedCompositeComponents(__return_storage_ptr__);
  while (elem_type._4_4_ != 0) {
    CreateScalarInterfaceVarsForReplacement
              ((NestedCompositeComponents *)local_68,this,interface_var_type_00,storage_class,
               extra_array_length);
    NestedCompositeComponents::AddComponent
              (__return_storage_ptr__,(NestedCompositeComponents *)local_68);
    elem_type._4_4_ = elem_type._4_4_ - 1;
    NestedCompositeComponents::~NestedCompositeComponents((NestedCompositeComponents *)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

InterfaceVariableScalarReplacement::NestedCompositeComponents
InterfaceVariableScalarReplacement::CreateScalarInterfaceVarsForArray(
    Instruction* interface_var_type, spv::StorageClass storage_class,
    uint32_t extra_array_length) {
  assert(interface_var_type->opcode() == spv::Op::OpTypeArray);

  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  uint32_t array_length = GetArrayLength(def_use_mgr, interface_var_type);
  Instruction* elem_type = GetArrayElementType(def_use_mgr, interface_var_type);

  NestedCompositeComponents scalar_vars;
  while (array_length > 0) {
    NestedCompositeComponents scalar_vars_for_element =
        CreateScalarInterfaceVarsForReplacement(elem_type, storage_class,
                                                extra_array_length);
    scalar_vars.AddComponent(scalar_vars_for_element);
    --array_length;
  }
  return scalar_vars;
}